

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverIo.c
# Opt level: O1

void Msat_SolverWriteDimacs(Msat_Solver_t *p,char *pFileName)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  tm *__tp;
  char *pcVar3;
  size_t sVar4;
  Msat_Clause_t **ppMVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  time_t ltime;
  time_t tStack_38;
  
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  iVar2 = Msat_ClauseVecReadSize(p->vLearned);
  uVar7 = iVar2 + iVar1;
  if (0 < (long)p->nVars) {
    lVar6 = 0;
    do {
      uVar7 = uVar7 + (p->pLevel[lVar6] == 0);
      lVar6 = lVar6 + 1;
    } while (p->nVars != lVar6);
  }
  __stream = fopen(pFileName,"wb");
  time(&tStack_38);
  __tp = localtime(&tStack_38);
  pcVar3 = asctime(__tp);
  sVar4 = strlen(pcVar3);
  pcVar3[sVar4 - 1] = '\0';
  strcpy(Msat_TimeStamp_Buffer,pcVar3);
  fprintf(__stream,"c Produced by Msat_SolverWriteDimacs() on %s\n",Msat_TimeStamp_Buffer);
  fprintf(__stream,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)uVar7);
  uVar7 = Msat_ClauseVecReadSize(p->vClauses);
  ppMVar5 = Msat_ClauseVecReadArray(p->vClauses);
  if (0 < (int)uVar7) {
    uVar8 = 0;
    do {
      Msat_ClauseWriteDimacs((FILE *)__stream,ppMVar5[uVar8],1);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  uVar7 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar5 = Msat_ClauseVecReadArray(p->vLearned);
  if (0 < (int)uVar7) {
    uVar8 = 0;
    do {
      Msat_ClauseWriteDimacs((FILE *)__stream,ppMVar5[uVar8],1);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (0 < p->nVars) {
    lVar6 = 0;
    do {
      if (p->pLevel[lVar6] == 0) {
        pcVar3 = "";
        if ((*(byte *)(p->pAssigns + lVar6) & 1) != 0) {
          pcVar3 = "-";
        }
        fprintf(__stream,"%s%d 0\n",pcVar3,(ulong)((int)lVar6 + 1));
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nVars);
  }
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Msat_SolverWriteDimacs( Msat_Solver_t * p, char * pFileName )
{
    FILE * pFile;
    Msat_Clause_t ** pClauses;
    int nClauses, i;

    nClauses = Msat_ClauseVecReadSize(p->vClauses) + Msat_ClauseVecReadSize(p->vLearned);
    for ( i = 0; i < p->nVars; i++ )
        nClauses += ( p->pLevel[i] == 0 );

    pFile = fopen( pFileName, "wb" );
    fprintf( pFile, "c Produced by Msat_SolverWriteDimacs() on %s\n", Msat_TimeStamp() );
    fprintf( pFile, "p cnf %d %d\n", p->nVars, nClauses );

    nClauses = Msat_ClauseVecReadSize( p->vClauses );
    pClauses = Msat_ClauseVecReadArray( p->vClauses );
    for ( i = 0; i < nClauses; i++ )
        Msat_ClauseWriteDimacs( pFile, pClauses[i], 1 );

    nClauses = Msat_ClauseVecReadSize( p->vLearned );
    pClauses = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nClauses; i++ )
        Msat_ClauseWriteDimacs( pFile, pClauses[i], 1 );

    // write zero-level assertions
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pLevel[i] == 0 )
            fprintf( pFile, "%s%d 0\n", ((p->pAssigns[i]&1)? "-": ""), i + 1 );

    fprintf( pFile, "\n" );
    fclose( pFile );
}